

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

wchar_t calc_blows(player *p,object *obj,player_state_conflict *state,wchar_t extra_blows)

{
  int16_t iVar1;
  int iVar2;
  wchar_t local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  wchar_t min_weight;
  wchar_t weight;
  wchar_t blow_energy;
  wchar_t div;
  wchar_t dex_index;
  wchar_t str_index;
  wchar_t blows;
  wchar_t extra_blows_local;
  player_state_conflict *state_local;
  object *obj_local;
  player *p_local;
  
  if (obj == (object *)0x0) {
    local_44 = 0;
  }
  else {
    iVar1 = object_weight_one(obj);
    local_44 = (int)iVar1;
  }
  local_48 = p->class->min_weight;
  if (local_48 <= local_44) {
    local_48 = local_44;
  }
  div = (adj_str_blow[state->stat_ind[0]] * p->class->att_multiply) / local_48;
  if (L'\v' < div) {
    div = L'\v';
  }
  if (adj_dex_blow[state->stat_ind[3]] < 0xc) {
    local_4c = adj_dex_blow[state->stat_ind[3]];
  }
  else {
    local_4c = 0xb;
  }
  if (p->class->max_attacks * 100 < (int)(10000 / (long)blows_table[div][local_4c])) {
    local_50 = p->class->max_attacks * 100;
  }
  else {
    local_50 = (int)(10000 / (long)blows_table[div][local_4c]);
  }
  iVar2 = 100;
  if (((p->opts).opt[0x2c] & 1U) != 0) {
    iVar2 = 200;
  }
  if (local_50 + extra_blows * 100 < iVar2) {
    local_54 = L'd';
    if (((p->opts).opt[0x2c] & 1U) != 0) {
      local_54 = L'È';
    }
  }
  else {
    local_54 = local_50 + extra_blows * 100;
  }
  return local_54;
}

Assistant:

int calc_blows(struct player *p, const struct object *obj,
			   struct player_state *state, int extra_blows)
{
	int blows;
	int str_index, dex_index;
	int div;
	int blow_energy;

	int weight = (obj == NULL) ? 0 : object_weight_one(obj);
	int min_weight = p->class->min_weight;

	/* Enforce a minimum "weight" (tenth pounds) */
	div = (weight < min_weight) ? min_weight : weight;

	/* Get the strength vs weight */
	str_index = adj_str_blow[state->stat_ind[STAT_STR]] *
			p->class->att_multiply / div;

	/* Maximal value */
	if (str_index > 11) str_index = 11;

	/* Index by dexterity */
	dex_index = MIN(adj_dex_blow[state->stat_ind[STAT_DEX]], 11);

	/* Use the blows table to get energy per blow */
	blow_energy = blows_table[str_index][dex_index];

	blows = MIN((10000 / blow_energy), (100 * p->class->max_attacks));

	/* Require at least one blow, two for O-combat */
	return MAX(blows + (100 * extra_blows),
			   OPT(p, birth_percent_damage) ? 200 : 100);
}